

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int shell_(int pi,char *scriptName,char *scriptString)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  gpioExtent_t ext [2];
  
  sVar2 = strlen(scriptName);
  sVar3 = strlen(scriptString);
  iVar1 = (int)sVar2;
  ext[0].size = (size_t)(iVar1 + 1);
  ext[1].size = (size_t)(int)sVar3;
  ext[0].ptr = scriptName;
  ext[1].ptr = scriptString;
  iVar1 = pigpio_command_ext(pi,0x6e,iVar1,0,iVar1 + 1 + (int)sVar3,2,ext,1);
  return iVar1;
}

Assistant:

int shell_(int pi, char *scriptName, char *scriptString)
{
   int ln, ls;
   gpioExtent_t ext[2];

   ln = strlen(scriptName);
   ls = strlen(scriptString);
   /*
   p1=len(scriptName)
   p2=0
   p3=len(scriptName) + len(scriptString) + 1
   ## extension ##
   char[]
   */

   ext[0].size = ln + 1; /* include null byte */
   ext[0].ptr = scriptName;

   ext[1].size = ls;
   ext[1].ptr = scriptString;

   return pigpio_command_ext
      (pi, PI_CMD_SHELL, ln, 0, ln+ls+1, 2, ext, 1);
}